

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordQueryReliablePdu.cpp
# Opt level: O1

void __thiscall
DIS::RecordQueryReliablePdu::unmarshal(RecordQueryReliablePdu *this,DataStream *dataStream)

{
  uint *d;
  pointer pFVar1;
  pointer pFVar2;
  pointer pFVar3;
  ulong uVar4;
  FourByteChunk x;
  FourByteChunk local_40;
  
  SimulationManagementWithReliabilityFamilyPdu::unmarshal
            (&this->super_SimulationManagementWithReliabilityFamilyPdu,dataStream);
  DataStream::operator>>(dataStream,&this->_requestID);
  DataStream::operator>>(dataStream,&this->_requiredReliabilityService);
  DataStream::operator>>(dataStream,&this->_pad1);
  DataStream::operator>>(dataStream,&this->_pad2);
  DataStream::operator>>(dataStream,&this->_eventType);
  DataStream::operator>>(dataStream,&this->_time);
  d = &this->_numberOfRecords;
  DataStream::operator>>(dataStream,d);
  pFVar1 = (this->_recordIDs).
           super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pFVar2 = (this->_recordIDs).
           super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pFVar3 = pFVar1;
  if (pFVar2 != pFVar1) {
    do {
      (**pFVar3->_vptr_FourByteChunk)(pFVar3);
      pFVar3 = pFVar3 + 1;
    } while (pFVar3 != pFVar2);
    (this->_recordIDs).super__Vector_base<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>.
    _M_impl.super__Vector_impl_data._M_finish = pFVar1;
  }
  if (*d != 0) {
    uVar4 = 0;
    do {
      FourByteChunk::FourByteChunk(&local_40);
      FourByteChunk::unmarshal(&local_40,dataStream);
      std::vector<DIS::FourByteChunk,_std::allocator<DIS::FourByteChunk>_>::push_back
                (&this->_recordIDs,&local_40);
      FourByteChunk::~FourByteChunk(&local_40);
      uVar4 = uVar4 + 1;
    } while (uVar4 < *d);
  }
  return;
}

Assistant:

void RecordQueryReliablePdu::unmarshal(DataStream& dataStream)
{
    SimulationManagementWithReliabilityFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    dataStream >> _requestID;
    dataStream >> _requiredReliabilityService;
    dataStream >> _pad1;
    dataStream >> _pad2;
    dataStream >> _eventType;
    dataStream >> _time;
    dataStream >> _numberOfRecords;

     _recordIDs.clear();
     for(size_t idx = 0; idx < _numberOfRecords; idx++)
     {
        FourByteChunk x;
        x.unmarshal(dataStream);
        _recordIDs.push_back(x);
     }
}